

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.hpp
# Opt level: O0

void __thiscall PA4Application::RenderObjectPart::~RenderObjectPart(RenderObjectPart *this)

{
  RenderObjectPart *this_local;
  
  std::shared_ptr<Texture>::~shared_ptr(&this->m_texture);
  std::shared_ptr<Program>::~shared_ptr(&this->m_program);
  std::shared_ptr<VAO>::~shared_ptr(&this->m_vao);
  return;
}

Assistant:

RenderObjectPart(const RenderObjectPart &) = delete;